

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::
write_significand<fmt::v11::basic_appender<char>,char,char_const*,fmt::v11::detail::digit_grouping<char>>
          (basic_appender<char> out,char *significand,int significand_size,int integral_size,
          char decimal_point,digit_grouping<char> *grouping)

{
  basic_appender<char> bVar1;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_> buffer;
  undefined1 *local_240;
  long local_238;
  undefined8 local_230;
  code *local_228;
  undefined1 local_220 [504];
  
  if ((grouping->thousands_sep_)._M_string_length == 0) {
    bVar1 = write_significand<fmt::v11::basic_appender<char>,char>
                      (out,significand,significand_size,integral_size,decimal_point);
    return (basic_appender<char>)bVar1.container;
  }
  local_238 = 0;
  local_228 = basic_memory_buffer<char,_500UL,_fmt::v11::detail::allocator<char>_>::grow;
  local_230 = 500;
  local_240 = local_220;
  write_significand<fmt::v11::basic_appender<char>,char>
            ((buffer<char> *)&local_240,significand,significand_size,integral_size,decimal_point);
  if (-1 < integral_size) {
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_240;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v11::basic_appender<char>,char>(grouping,out,digits);
    bVar1 = copy_noinline<char,char*,fmt::v11::basic_appender<char>>
                      (local_240 + (uint)integral_size,local_240 + local_238,out);
    if (local_240 != local_220) {
      free(local_240);
    }
    return (basic_appender<char>)bVar1.container;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O3/_deps/fmt-src/include/fmt/base.h"
              ,0x1b6,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.has_separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(basic_appender<Char>(buffer), significand, significand_size,
                    integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_noinline<Char>(buffer.data() + integral_size,
                                     buffer.end(), out);
}